

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O1

void __thiscall tonk::Connection::onP2PStartConnect(Connection *this,P2PConnectParams *params)

{
  INATPortPool *pIVar1;
  undefined8 uVar2;
  ushort uVar3;
  uint64_t uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  P2PConnectParams startParams;
  undefined8 local_88;
  uint64_t uStack_80;
  undefined8 uStack_78;
  uint64_t uStack_70;
  undefined4 local_68;
  undefined8 local_64;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined8 uStack_50;
  UDPAddress local_3c;
  
  local_68._0_2_ = params->SelfExternalPort;
  local_68._2_2_ = params->PeerNATMappedPort;
  local_88 = *(undefined8 *)params;
  uStack_80 = params->EncryptionKey;
  uStack_78._0_2_ = params->ProtocolRoundIntervalMsec;
  uStack_78._2_2_ = params->ShotTS16;
  uStack_78._4_4_ = *(undefined4 *)&params->field_0x14;
  uStack_70 = params->ShotTimeUsec;
  local_64 = *(undefined8 *)&(params->PeerExternalAddress).impl_.data_;
  uVar2 = *(undefined8 *)((long)&(params->PeerExternalAddress).impl_.data_ + 0xc);
  uStack_50 = *(undefined8 *)((long)&(params->PeerExternalAddress).impl_.data_ + 0x14);
  uStack_5c = (undefined4)*(undefined8 *)((long)&(params->PeerExternalAddress).impl_.data_ + 8);
  uStack_58 = (undefined4)uVar2;
  uStack_54 = (undefined4)((ulong)uVar2 >> 0x20);
  uVar4 = siamese::GetTimeUsec();
  LOCK();
  (this->LastTickUsec).super___atomic_base<unsigned_long>._M_i = uVar4;
  UNLOCK();
  uVar6 = (ulong)params->ShotTS16;
  uVar7 = uVar4 >> 9 & 0xffff;
  uVar5 = uVar4 >> 9 & 0xffffffffffff0000 | uVar6;
  if (uVar7 < uVar6) {
    uVar8 = uVar5 - 0x10000;
    bVar9 = uVar6 - uVar7 < 0x4000;
  }
  else {
    uVar8 = uVar5 + 0x10000;
    bVar9 = uVar7 - uVar6 < 0xc001;
  }
  if (bVar9) {
    uVar8 = uVar5;
  }
  uStack_70 = uVar8 << 9;
  pIVar1 = (this->Deps).NATPool;
  getSelfAddress(&local_3c,this);
  uVar3 = swap_bytes(local_3c.impl_.data_.v4.sin_port);
  (*pIVar1->_vptr_INATPortPool[2])
            (pIVar1,(ulong)uVar3,(ulong)this->LocallyAssignedIdForRemoteHost,&local_88);
  return;
}

Assistant:

void Connection::onP2PStartConnect(const protocol::P2PConnectParams& params)
{
    protocol::P2PConnectParams startParams = params;
    startParams.ShotTimeUsec = TimeSync.FromLocalTime16(GetTicksUsec(), params.ShotTS16);

    Deps.NATPool->OnP2PStartConnect(
        getSelfAddress().port(),
        LocallyAssignedIdForRemoteHost,
        startParams);
}